

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O0

bool __thiscall
DIS::IncomingMessage::RemoveProcessor(IncomingMessage *this,uchar id,IPacketProcessor *pp)

{
  bool bVar1;
  iterator local_30;
  iterator containerIter;
  IPacketProcessor *pp_local;
  uchar id_local;
  IncomingMessage *this_local;
  
  containerIter._M_node = (_Base_ptr)pp;
  std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>::
  _Rb_tree_iterator(&local_30);
  bVar1 = FindProccessorContainer(this,id,(IPacketProcessor *)containerIter._M_node,&local_30);
  if (bVar1) {
    std::
    multimap<unsigned_char,DIS::IPacketProcessor*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
    ::erase_abi_cxx11_((multimap<unsigned_char,DIS::IPacketProcessor*,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
                        *)&this->_processors,local_30);
  }
  return bVar1;
}

Assistant:

bool IncomingMessage::RemoveProcessor(unsigned char id, const IPacketProcessor* pp)
{
   PacketProcessorContainer::iterator containerIter;

   if (FindProccessorContainer(id, pp, containerIter))
   {
      // Erases only the single pair found in the interator
      _processors.erase( containerIter );
      return true;
   }

   // The pair doesn't exist
   return false;
}